

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_state_servergreet_resp(connectdata *conn,int smtpcode,smtpstate instate)

{
  Curl_easy *data;
  CURLcode result;
  smtpstate instate_local;
  int smtpcode_local;
  connectdata *conn_local;
  
  if (smtpcode / 100 == 2) {
    data._4_4_ = smtp_perform_ehlo(conn);
  }
  else {
    Curl_failf(conn->data,"Got unexpected smtp-server response: %d",(ulong)(uint)smtpcode);
    data._4_4_ = CURLE_WEIRD_SERVER_REPLY;
  }
  return data._4_4_;
}

Assistant:

static CURLcode smtp_state_servergreet_resp(struct connectdata *conn,
                                            int smtpcode,
                                            smtpstate instate)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;

  (void)instate; /* no use for this yet */

  if(smtpcode/100 != 2) {
    failf(data, "Got unexpected smtp-server response: %d", smtpcode);
    result = CURLE_WEIRD_SERVER_REPLY;
  }
  else
    result = smtp_perform_ehlo(conn);

  return result;
}